

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

void Curl_cwriter_remove_by_name(Curl_easy *data,char *name)

{
  Curl_cwriter *pCVar1;
  int iVar2;
  Curl_cwriter **ppCVar3;
  Curl_cwriter *w;
  Curl_cwriter *pCVar4;
  
  pCVar4 = (data->req).writer_stack;
  if (pCVar4 != (Curl_cwriter *)0x0) {
    ppCVar3 = &(data->req).writer_stack;
    do {
      while( true ) {
        iVar2 = strcmp(name,pCVar4->cwt->name);
        pCVar1 = pCVar4->next;
        if (iVar2 != 0) break;
        *ppCVar3 = pCVar1;
        (*pCVar4->cwt->do_close)(data,pCVar4);
        (*Curl_cfree)(pCVar4);
        pCVar4 = *ppCVar3;
        if (*ppCVar3 == (Curl_cwriter *)0x0) {
          return;
        }
      }
      ppCVar3 = &pCVar4->next;
      pCVar4 = pCVar1;
    } while (pCVar1 != (Curl_cwriter *)0x0);
  }
  return;
}

Assistant:

void Curl_cwriter_remove_by_name(struct Curl_easy *data,
                                 const char *name)
{
  struct Curl_cwriter **anchor = &data->req.writer_stack;

  while(*anchor) {
    if(!strcmp(name, (*anchor)->cwt->name)) {
      struct Curl_cwriter *w = (*anchor);
      *anchor = w->next;
      Curl_cwriter_free(data, w);
      continue;
    }
    anchor = &((*anchor)->next);
  }
}